

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::Null(Builder *this)

{
  anon_union_8_3_83789bcb_for_Value_0 local_18;
  undefined8 uStack_10;
  
  local_18.i_ = 0;
  uStack_10 = 0;
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
  emplace_back<flexbuffers::Builder::Value>(&this->stack_,(Value *)&local_18);
  return;
}

Assistant:

void Null() { stack_.push_back(Value()); }